

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool QtPrivate::QLessThanOperatorForType<QList<Qt::Key>,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  
  piVar1 = *(int **)((long)b + 8);
  uVar2 = *(ulong *)((long)b + 0x10);
  uVar3 = *(ulong *)((long)a + 0x10);
  if ((long)uVar2 < (long)*(ulong *)((long)a + 0x10)) {
    uVar3 = uVar2;
  }
  piVar4 = piVar1;
  if ((uVar3 & 0x3fffffffffffffff) != 0) {
    piVar5 = *(int **)((long)a + 8);
    piVar6 = piVar5 + uVar3;
    do {
      if (*piVar4 != *piVar5) {
        return *piVar5 < *piVar4;
      }
      piVar5 = piVar5 + 1;
      piVar4 = piVar4 + 1;
    } while (piVar5 != piVar6);
  }
  return piVar4 != piVar1 + uVar2;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }